

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

int drawnumber_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,
                    _array *ap,t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,
                    int dbl,int doit)

{
  _instancetemplate *p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  t_float tVar5;
  int y2;
  int x2;
  int y1;
  t_scalar *local_58;
  _array *local_50;
  int onset;
  int x1;
  int type;
  t_symbol *arraytype;
  
  local_58 = sc;
  local_50 = ap;
  drawnumber_getrect(z,glist,data,template,basex,basey,&x1,&y1,&x2,&y2);
  iVar3 = 0;
  if ((((x1 <= xpix) && (xpix <= x2)) && (y1 <= ypix)) && (iVar3 = 0, ypix <= y2)) {
    iVar2 = template_find_field(template,(t_symbol *)z[3].g_pd,&onset,&type,&arraytype);
    iVar3 = 0;
    uVar4 = 0xffffffff;
    if (type != 3) {
      uVar4 = type;
    }
    uVar4 = uVar4 | -(uint)(iVar2 == 0);
    if ((uVar4 < 2) && (iVar3 = 1, doit != 0)) {
      p_Var1 = (pd_maininstance.pd_gui)->i_template;
      *(_glist **)(p_Var1 + 200) = glist;
      *(t_word **)(p_Var1 + 0xe0) = data;
      *(t_template **)(p_Var1 + 0xe8) = template;
      *(t_scalar **)(p_Var1 + 0xd0) = local_58;
      *(_array **)(p_Var1 + 0xd8) = local_50;
      *(undefined4 *)(p_Var1 + 0x10c) = 1;
      tVar5 = template_getfloat(template,(t_symbol *)z[3].g_pd,data,0);
      p_Var1 = (pd_maininstance.pd_gui)->i_template;
      *(t_float *)(p_Var1 + 0xc0) = tVar5;
      *(uint *)(p_Var1 + 0x108) = uVar4;
      if (*(t_scalar **)(p_Var1 + 0xd0) == (t_scalar *)0x0) {
        gpointer_setarray((t_gpointer *)(p_Var1 + 0xf0),*(_array **)(p_Var1 + 0xd8),
                          *(t_word **)(p_Var1 + 0xe0));
      }
      else {
        gpointer_setglist((t_gpointer *)(p_Var1 + 0xf0),*(_glist **)(p_Var1 + 200),
                          *(t_scalar **)(p_Var1 + 0xd0));
      }
      glist_grab(glist,z,drawnumber_motionfn,drawnumber_key,xpix,ypix);
    }
  }
  return iVar3;
}

Assistant:

static int drawnumber_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_drawnumber *x = (t_drawnumber *)z;
    int x1, y1, x2, y2, type, onset;
    drawnumber_getrect(z, glist,
        data, template, basex, basey,
        &x1, &y1, &x2, &y2);
    if (xpix >= x1 && xpix <= x2 && ypix >= y1 && ypix <= y2 &&
        ((type = drawnumber_gettype(x, data, template, &onset)) == DT_FLOAT ||
            type == DT_SYMBOL))
    {
        if (doit)
        {
            TEMPLATE->drawnumber_motion_glist = glist;
            TEMPLATE->drawnumber_motion_wp = data;
            TEMPLATE->drawnumber_motion_template = template;
            TEMPLATE->drawnumber_motion_scalar = sc;
            TEMPLATE->drawnumber_motion_array = ap;
            TEMPLATE->drawnumber_motion_firstkey = 1;
            TEMPLATE->drawnumber_motion_ycumulative =
                template_getfloat(template, x->x_fieldname, data, 0);
            TEMPLATE->drawnumber_motion_type = type;
            if (TEMPLATE->drawnumber_motion_scalar)
                gpointer_setglist(&TEMPLATE->drawnumber_motion_gpointer,
                    TEMPLATE->drawnumber_motion_glist,
                        TEMPLATE->drawnumber_motion_scalar);
            else gpointer_setarray(&TEMPLATE->drawnumber_motion_gpointer,
                    TEMPLATE->drawnumber_motion_array,
                        TEMPLATE->drawnumber_motion_wp);
            glist_grab(glist, z, drawnumber_motionfn, drawnumber_key,
                xpix, ypix);
        }
        return (1);
    }
    else return (0);
}